

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  float fVar1;
  bool bVar2;
  CurveCommon *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Point3fi pi;
  Vector3f dpdu;
  Ray *pRVar6;
  bool bVar7;
  ShapeIntersection *pSVar8;
  Point3<float> *pPVar9;
  Bounds3<float> *b;
  long lVar10;
  Tuple3<pbrt::Vector3,_float> *this_00;
  float *pfVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar16 [48];
  undefined1 auVar14 [64];
  type tVar17;
  float fVar18;
  float fVar19;
  type tVar20;
  undefined8 uVar30;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar32 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar33;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar34;
  undefined1 in_XMM10 [16];
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  Normal3<float> NVar35;
  Normal3<float> NVar36;
  Point3f PVar37;
  Vector3<float> VVar38;
  Vector3<float> VVar39;
  Vector3f axis;
  Vector3f dpdv;
  float local_368;
  Tuple3<pbrt::Vector3,_float> local_348;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  Tuple3<pbrt::Vector3,_float> *local_310;
  float local_304;
  Bounds3<float> local_300;
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  Ray *local_2c8;
  Curve *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  Float u [3];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  Bounds3f rayBounds;
  Vector3f pError;
  Bounds3f curveBounds;
  array<pbrt::Point3<float>,_7> cpSplit;
  undefined1 auVar15 [64];
  undefined8 uVar31;
  
  auVar16 = in_ZmmResult._16_48_;
  pPVar9 = cp.ptr;
  local_310 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>;
  local_328._4_4_ = in_XMM1_Db;
  local_328._0_4_ = u0;
  local_328._8_4_ = in_XMM1_Dc;
  local_328._12_4_ = in_XMM1_Dd;
  uStack_2e0 = local_2e8;
  local_2e8 = (undefined1  [8])ObjectFromRay;
  local_338._0_4_ = tMax;
  local_2c8 = ray;
  tVar17 = Length<float>((Vector3<float> *)local_310);
  if (depth < 1) {
    fVar33 = (pPVar9->super_Tuple3<pbrt::Point3,_float>).x;
    fVar18 = (pPVar9->super_Tuple3<pbrt::Point3,_float>).y;
    auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(fVar33 * (fVar33 - pPVar9[1].
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                       ))),ZEXT416((uint)fVar18),
                               ZEXT416((uint)(pPVar9[1].super_Tuple3<pbrt::Point3,_float>.y - fVar18
                                             )));
    if (0.0 <= auVar12._0_4_) {
      fVar19 = pPVar9[3].super_Tuple3<pbrt::Point3,_float>.x;
      fVar1 = pPVar9[3].super_Tuple3<pbrt::Point3,_float>.y;
      auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(fVar19 * (fVar19 - pPVar9[2].
                                                                   super_Tuple3<pbrt::Point3,_float>
                                                                   .x))),ZEXT416((uint)fVar1),
                                 ZEXT416((uint)(pPVar9[2].super_Tuple3<pbrt::Point3,_float>.y -
                                               fVar1)));
      if (0.0 <= auVar12._0_4_) {
        fVar19 = fVar19 - fVar33;
        fVar1 = fVar1 - fVar18;
        fVar34 = fVar1 * fVar1 + fVar19 * fVar19;
        if ((fVar34 != 0.0) || (NAN(fVar34))) {
          auVar12._8_4_ = 0x80000000;
          auVar12._0_8_ = 0x8000000080000000;
          auVar12._12_4_ = 0x80000000;
          auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar18),auVar12);
          pCVar3 = this->common;
          auVar21 = ZEXT416((uint)(fVar1 * auVar12._0_4_));
          auVar13 = vfnmadd213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar33),auVar21);
          auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar1),auVar12,auVar21);
          fVar34 = (auVar13._0_4_ + auVar12._0_4_) / fVar34;
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(u1 * fVar34)),local_328,
                                    ZEXT416((uint)(1.0 - fVar34)));
          auVar12 = vminss_avx(ZEXT416((uint)u1),auVar13);
          uVar31 = vcmpss_avx512f(auVar13,local_328,1);
          bVar7 = (bool)((byte)uVar31 & 1);
          auVar15._16_48_ = auVar16;
          auVar15._0_16_ = auVar12;
          auVar14._4_60_ = auVar15._4_60_;
          auVar14._0_4_ = (float)((uint)bVar7 * local_328._0_4_ + (uint)!bVar7 * auVar12._0_4_);
          local_328 = auVar14._0_16_;
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * pCVar3->width[1])),
                                    ZEXT416((uint)(1.0 - auVar14._0_4_)),
                                    ZEXT416((uint)pCVar3->width[0]));
          local_368 = auVar12._0_4_;
          local_300.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
          local_300.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
          local_300.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
          if (pCVar3->type == Ribbon) {
            fVar33 = pCVar3->normalAngle;
            if ((fVar33 != 0.0) || (NAN(fVar33))) {
              fVar18 = sinf((1.0 - auVar14._0_4_) * fVar33);
              fVar33 = this->common->invSinNormalAngle;
              fVar19 = sinf((float)local_328._0_4_ * this->common->normalAngle);
              local_2d8._0_4_ = fVar19 * this->common->invSinNormalAngle;
              uVar31 = 0;
              NVar35 = Tuple3<pbrt::Normal3,float>::operator*
                                 ((Tuple3<pbrt::Normal3,float> *)this->common->n,fVar18 * fVar33);
              local_304 = NVar35.super_Tuple3<pbrt::Normal3,_float>.z;
              uVar30 = 0;
              NVar36 = Tuple3<pbrt::Normal3,float>::operator*
                                 ((Tuple3<pbrt::Normal3,float> *)(this->common->n + 1),
                                  (float)local_2d8._0_4_);
              local_288 = NVar35.super_Tuple3<pbrt::Normal3,_float>.x;
              fStack_284 = NVar35.super_Tuple3<pbrt::Normal3,_float>.y;
              fStack_280 = (float)uVar31;
              fStack_27c = (float)((ulong)uVar31 >> 0x20);
              auVar13._0_4_ = NVar36.super_Tuple3<pbrt::Normal3,_float>.x + local_288;
              auVar13._4_4_ = NVar36.super_Tuple3<pbrt::Normal3,_float>.y + fStack_284;
              auVar13._8_4_ = (float)uVar30 + fStack_280;
              auVar13._12_4_ = (float)((ulong)uVar30 >> 0x20) + fStack_27c;
              local_300.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                   NVar36.super_Tuple3<pbrt::Normal3,_float>.z + local_304;
              local_300.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
            }
            else {
              local_300.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                   pCVar3->n[0].super_Tuple3<pbrt::Normal3,_float>.z;
              local_300.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                   pCVar3->n[0].super_Tuple3<pbrt::Normal3,_float>.x;
              local_300.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                   pCVar3->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
            }
            tVar20 = AbsDot<float>((Normal3<float> *)&local_300,(Vector3<float> *)local_310);
            local_368 = local_368 * (tVar20 / tVar17);
          }
          auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar34));
          u[0] = 0.0;
          u[1] = 0.0;
          u[2] = 0.0;
          uVar31 = vcmpss_avx512f(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40,1);
          auVar32 = ZEXT856(auVar12._8_8_);
          PVar37 = EvaluateCubicBezier(cp,(Float)((uint)!(bool)((byte)uVar31 & 1) * auVar12._0_4_),
                                       (Vector3f *)u);
          fVar33 = PVar37.super_Tuple3<pbrt::Point3,_float>.z;
          auVar24._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar24._8_56_ = auVar32;
          auVar21 = auVar24._0_16_;
          auVar12 = vmovshdup_avx(auVar21);
          auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar12._0_4_)),auVar21,auVar21);
          if (auVar13._0_4_ <= local_368 * local_368 * 0.25) {
            if (fVar33 < 0.0) {
              return false;
            }
            if (fVar33 <= tVar17 * (float)local_338._0_4_) {
              if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
                local_338._0_4_ = auVar13._0_4_;
                if (si->set == true) {
                  local_2d8 = auVar12;
                  pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value(si);
                  auVar24 = ZEXT1664(auVar21);
                  auVar12 = local_2d8;
                  if (pSVar8->tHit < fVar33 / tVar17) {
                    return false;
                  }
                }
                local_348.x = 0.0;
                local_348.y = 0.0;
                local_348.z = 0.0;
                auVar12 = vfnmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ * u[1])),auVar12,
                                           ZEXT416((uint)u[0]));
                cp_01.ptr = this->common->cpObj;
                cp_01.n = 4;
                EvaluateCubicBezier(cp_01,(Float)local_328._0_4_,(Vector3f *)&local_348);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
                fVar18 = cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_348.x;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_348.y;
                uVar31 = curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_348.x;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_348.z;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_348.z;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar31;
                if (curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x == 0.0) {
                  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_348.y;
                  if ((((curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y == 0.0) &&
                       (!NAN(curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y))) &&
                      (local_348.z == 0.0)) && (!NAN(local_348.z))) {
                    cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = fVar18;
                    LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
                               ,0x2b2,"Check failed: %s != %s with %s = %s, %s = %s",
                               (char (*) [18])"Vector3f(0, 0, 0)",(char (*) [5])"dpdu",
                               (char (*) [18])"Vector3f(0, 0, 0)",(Vector3<float> *)&cpSplit,
                               (char (*) [5])"dpdu",(Vector3<float> *)&curveBounds);
                  }
                }
                auVar13 = vsqrtss_avx(in_XMM10,ZEXT416((uint)local_338._0_4_));
                uVar31 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416(auVar12._0_4_),1);
                bVar7 = (bool)((byte)uVar31 & 1);
                auVar22._0_4_ = auVar13._0_4_ / local_368;
                auVar22._4_12_ = auVar13._4_12_;
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar12 = vxorps_avx512vl(auVar22,auVar21);
                auVar32 = (undefined1  [56])0x0;
                local_338 = ZEXT416((uint)((float)((uint)bVar7 * (int)auVar22._0_4_ +
                                                  (uint)!bVar7 * auVar12._0_4_) + 0.5));
                if (this->common->type == Ribbon) {
                  VVar38 = Cross<float>((Normal3<float> *)&local_300,(Vector3<float> *)&local_348);
                  uVar31 = auVar32._0_8_;
                  auVar25._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar25._8_56_ = auVar32;
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ =
                       vmovlps_avx(auVar25._0_16_);
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                       VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  VVar38 = Normalize<float>((Vector3<float> *)&cpSplit);
                  local_2e8._4_4_ = local_368 * VVar38.super_Tuple3<pbrt::Vector3,_float>.y;
                  local_2e8._0_4_ = local_368 * VVar38.super_Tuple3<pbrt::Vector3,_float>.x;
                  uStack_2e0._0_4_ = local_368 * (float)uVar31;
                  uStack_2e0._4_4_ = local_368 * (float)((ulong)uVar31 >> 0x20);
                  fVar18 = local_368 * VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                }
                else {
                  this_00 = &local_348;
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z = fVar18;
                  VVar38 = Transform::ApplyInverse<float>
                                     ((Transform *)local_2e8,(Vector3<float> *)this_00);
                  uVar31 = auVar32._0_8_;
                  auVar26._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar26._8_56_ = auVar32;
                  local_2d8 = auVar26._0_16_;
                  auVar12 = vmovshdup_avx(local_2d8);
                  auVar4._8_4_ = 0x80000000;
                  auVar4._0_8_ = 0x8000000080000000;
                  auVar4._12_4_ = 0x80000000;
                  auVar12 = vxorps_avx512vl(auVar12,auVar4);
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y =
                       VVar38.super_Tuple3<pbrt::Vector3,_float>.x;
                  cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x = auVar12._0_4_;
                  cpSplit.values._8_8_ =
                       (ulong)(uint)cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x << 0x20;
                  VVar39 = Normalize<float>((Vector3<float> *)&cpSplit);
                  auVar12 = local_2d8;
                  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                       local_368 * VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar23._0_4_ = local_368 * VVar39.super_Tuple3<pbrt::Vector3,_float>.x;
                  auVar23._4_4_ = local_368 * VVar39.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar23._8_4_ = local_368 * (float)uVar31;
                  auVar23._12_4_ = local_368 * (float)((ulong)uVar31 >> 0x20);
                  auVar32 = ZEXT856(auVar23._8_8_);
                  curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar23);
                  if (this->common->type == Cylinder) {
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)((float)local_338._0_4_ * 90.0)),
                                              ZEXT416((uint)(1.0 - (float)local_338._0_4_)),
                                              ZEXT416(0xc2b40000));
                    auVar5._8_4_ = 0x80000000;
                    auVar5._0_8_ = 0x8000000080000000;
                    auVar5._12_4_ = 0x80000000;
                    auVar13 = vxorps_avx512vl(auVar13,auVar5);
                    auVar32 = ZEXT856(auVar13._8_8_);
                    axis.super_Tuple3<pbrt::Vector3,_float>.z =
                         VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                    axis.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2d8._0_4_;
                    axis.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2d8._4_4_;
                    local_2d8 = auVar12;
                    Rotate((Transform *)&cpSplit,(pbrt *)this_00,auVar13._0_4_,axis);
                    VVar38 = Transform::operator()
                                       ((Transform *)&cpSplit,(Vector3<float> *)&curveBounds);
                    curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                         VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar27._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar27._8_56_ = auVar32;
                    curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ =
                         vmovlps_avx(auVar27._0_16_);
                  }
                  VVar38 = Transform::operator()
                                     ((Transform *)local_2e8,(Vector3<float> *)&curveBounds);
                  fVar18 = VVar38.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar28._0_8_ = VVar38.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar28._8_56_ = auVar32;
                  _local_2e8 = auVar28._0_16_;
                }
                pRVar6 = local_2c8;
                pError.super_Tuple3<pbrt::Vector3,_float>.x = local_368 + local_368;
                auVar32 = (undefined1  [56])0x0;
                bVar7 = this->common->reverseOrientation;
                bVar2 = this->common->transformSwapsHandedness;
                pError.super_Tuple3<pbrt::Vector3,_float>.y =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                pError.super_Tuple3<pbrt::Vector3,_float>.z =
                     pError.super_Tuple3<pbrt::Vector3,_float>.x;
                PVar37 = Ray::operator()(local_2c8,fVar33 / tVar17);
                auVar29._0_8_ = PVar37.super_Tuple3<pbrt::Point3,_float>._0_8_;
                auVar29._8_56_ = auVar32;
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>._0_8_ =
                     vmovlps_avx(auVar29._0_16_);
                cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z =
                     PVar37.super_Tuple3<pbrt::Point3,_float>.z;
                Point3fi::Point3fi((Point3fi *)&rayBounds,cpSplit.values,&pError);
                VVar38 = Tuple3<pbrt::Vector3,_float>::operator-(local_310);
                auVar13 = _local_2e8;
                local_2a8 = 0;
                local_2a0 = 0;
                local_2b8 = 0;
                local_2b0 = 0;
                dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_348.z;
                dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_348.x;
                dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_348.y;
                auVar12 = vinsertps_avx(local_328,ZEXT416((uint)local_338._0_4_),0x10);
                pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                     rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
                pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
                     rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
                pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
                     rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
                pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
                     rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
                pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low =
                     rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
                pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
                     rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
                dpdv.super_Tuple3<pbrt::Vector3,_float>.z = fVar18;
                dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2e8._0_4_;
                dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2e8._4_4_;
                _local_2e8 = auVar13;
                SurfaceInteraction::SurfaceInteraction
                          ((SurfaceInteraction *)&curveBounds,pi,(Point2f)auVar12._0_8_,
                           (Vector3f)VVar38.super_Tuple3<pbrt::Vector3,_float>,dpdu,dpdv,
                           (Normal3f)ZEXT812(0),(Normal3f)ZEXT812(0),pRVar6->time,bVar7 != bVar2);
                Transform::operator()
                          ((SurfaceInteraction *)&cpSplit,this->common->renderFromObject,
                           (SurfaceInteraction *)&curveBounds);
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                     cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                     cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.y;
                curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                     cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.z;
                curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                     cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x;
                curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                     cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.y;
                curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                     cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.z;
                pstd::optional<pbrt::ShapeIntersection>::operator=(si,(ShapeIntersection *)&cpSplit)
                ;
              }
              *(long *)(in_FS_OFFSET + -0x568) = *(long *)(in_FS_OFFSET + -0x568) + 1;
              return true;
            }
            return false;
          }
        }
      }
    }
  }
  else {
    SubdivideCubicBezier(&cpSplit,cp);
    pfVar11 = u;
    u[1] = ((float)local_328._0_4_ + u1) * 0.5;
    u[0] = (Float)local_328._0_4_;
    u[2] = u1;
    local_2c0 = this;
    for (lVar10 = 0; pfVar11 = pfVar11 + 1, lVar10 != 0x48; lVar10 = lVar10 + 0x24) {
      fVar33 = *pfVar11;
      pPVar9 = (Point3<float> *)
               ((long)&cpSplit.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar10);
      fVar18 = local_2c0->common->width[1];
      auVar13 = ZEXT416((uint)local_2c0->common->width[0]);
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)((float)local_328._0_4_ * fVar18)),auVar13,
                                ZEXT416((uint)(1.0 - (float)local_328._0_4_)));
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar33)),auVar13,
                                ZEXT416((uint)(1.0 - fVar33)));
      auVar12 = vmaxss_avx(auVar13,auVar12);
      Bounds3<float>::Bounds3
                (&rayBounds,pPVar9,
                 (Point3<float> *)
                 ((long)&cpSplit.values[1].super_Tuple3<pbrt::Point3,_float>.x + lVar10));
      Bounds3<float>::Bounds3
                (&local_300,
                 (Point3<float> *)
                 ((long)&cpSplit.values[2].super_Tuple3<pbrt::Point3,_float>.x + lVar10),
                 (Point3<float> *)
                 ((long)&cpSplit.values[3].super_Tuple3<pbrt::Point3,_float>.x + lVar10));
      Union<float>(&curveBounds,&rayBounds,&local_300);
      Expand<float,float>(&rayBounds,(pbrt *)&curveBounds,b,auVar12._0_4_ * 0.5);
      local_300.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
      local_300.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
      local_300.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
      curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
           rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
           rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
      curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
           rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
           rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      curveBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
           rayBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
      curveBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
           rayBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      tVar17 = Length<float>((Vector3<float> *)local_310);
      local_348.z = tVar17 * (float)local_338._0_4_;
      local_348.x = 0.0;
      local_348.y = 0.0;
      Bounds3<float>::Bounds3(&rayBounds,&local_300.pMin,(Point3<float> *)&local_348);
      bVar7 = Overlaps<float>(&rayBounds,&curveBounds);
      if (bVar7) {
        cp_00.n = 4;
        cp_00.ptr = pPVar9;
        bVar7 = RecursiveIntersect(local_2c0,local_2c8,(Float)local_338._0_4_,cp_00,
                                   (Transform *)local_2e8,(Float)local_328._0_4_,fVar33,depth + -1,
                                   si);
        if ((si == (optional<pbrt::ShapeIntersection> *)0x0) && (bVar7)) {
          return true;
        }
      }
      local_328._4_4_ = 0;
      local_328._8_4_ = 0;
      local_328._12_4_ = 0;
      local_328._0_4_ = fVar33;
    }
    if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
      return si->set;
    }
  }
  return false;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            if (common->normalAngle == 0)
                nHit = common->n[0];
            else {
                Float sin0 =
                    std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
                Float sin1 =
                    std::sin(u * common->normalAngle) * common->invSinNormalAngle;
                nHit = sin0 * common->n[0] + sin1 * common->n[1];
            }
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}